

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS
ref_smooth_tet_ratio_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_ratio,REF_DBL *max_ratio)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_NODE ref_node;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  double dVar8;
  REF_DBL ratio;
  REF_INT nodes [27];
  long local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  if (-1 < node) {
    ref_cell = ref_grid->cell[8];
    pRVar1 = ref_cell->ref_adj;
    if ((node < pRVar1->nnode) && (local_b8 = (long)pRVar1->first[(uint)node], local_b8 != -1)) {
      ref_node = ref_grid->node;
      uVar4 = ref_cell_nodes(ref_cell,pRVar1->item[local_b8].ref,local_a8);
      if (uVar4 == 0) {
        bVar3 = true;
        do {
          if (0 < ref_cell->node_per) {
            lVar6 = 0;
            do {
              if (local_a8[lVar6] != node) {
                uVar4 = ref_node_ratio(ref_node,node,local_a8[lVar6],&local_b0);
                if (uVar4 != 0) {
                  pcVar7 = "ratio";
                  uVar5 = 0x508;
                  goto LAB_001cd7c4;
                }
                if (bVar3) {
                  *min_ratio = local_b0;
                  dVar8 = local_b0;
                }
                else {
                  dVar8 = *min_ratio;
                  if (local_b0 <= *min_ratio) {
                    dVar8 = local_b0;
                  }
                  *min_ratio = dVar8;
                  dVar8 = *max_ratio;
                  if (*max_ratio <= local_b0) {
                    dVar8 = local_b0;
                  }
                }
                *max_ratio = dVar8;
                bVar3 = false;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < ref_cell->node_per);
          }
          pRVar2 = ref_cell->ref_adj->item;
          local_b8 = (long)pRVar2[(int)local_b8].next;
          if (local_b8 == -1) {
            if (!bVar3) {
              return 0;
            }
            goto LAB_001cd7d9;
          }
          uVar4 = ref_cell_nodes(ref_cell,pRVar2[local_b8].ref,local_a8);
        } while (uVar4 == 0);
      }
      pcVar7 = "nodes";
      uVar5 = 0x505;
LAB_001cd7c4:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             uVar5,"ref_smooth_tet_ratio_around",(ulong)uVar4,pcVar7);
      return uVar4;
    }
  }
LAB_001cd7d9:
  *min_ratio = 2000.0;
  *max_ratio = -2.0;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x518,
         "ref_smooth_tet_ratio_around","no tet found, can not compute ratio");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_ratio_around(REF_GRID ref_grid, REF_INT node,
                                               REF_DBL *min_ratio,
                                               REF_DBL *max_ratio) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL ratio;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (node != nodes[cell_node]) {
        RSS(ref_node_ratio(ref_node, node, nodes[cell_node], &ratio), "ratio");
        if (none_found) {
          none_found = REF_FALSE;
          *min_ratio = ratio;
          *max_ratio = ratio;
        } else {
          *min_ratio = MIN(*min_ratio, ratio);
          *max_ratio = MAX(*max_ratio, ratio);
        }
      }
    }
  }

  if (none_found) {
    *min_ratio = 2000.0;
    *max_ratio = -2.0;
    THROW("no tet found, can not compute ratio");
  }

  return REF_SUCCESS;
}